

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrSig_SignWithNonce_Test::TestBody(SchnorrSig_SignWithNonce_Test *this)

{
  char *message;
  AssertHelper AStack_88;
  AssertionResult gtest_ar;
  string local_70;
  SchnorrSignature sig;
  string expected_sig;
  
  std::__cxx11::string::string
            ((string *)&expected_sig,
             "5da618c1936ec728e5ccff29207f1680dcf4146370bdcfab0039951b91e3637a958e91d68537d1f6f19687cec1fd5db1d83da56ef3ade1f3c611babd7d08af42"
             ,(allocator *)&sig);
  cfd::core::SchnorrUtil::SignWithNonce(&sig,&::msg,&::sk,&::nonce);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_(&local_70,&sig,false);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expected_sig","sig.GetHex()",&expected_sig,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::__cxx11::string::~string((string *)&expected_sig);
  return;
}

Assistant:

TEST(SchnorrSig, SignWithNonce) {
  std::string expected_sig =
      "5da618c1936ec728e5ccff29207f1680dcf4146370bdcfab0039951b91e3637a958e91d"
      "68537d1f6f19687cec1fd5db1d83da56ef3ade1f3c611babd7d08af42";

  auto sig = SchnorrUtil::SignWithNonce(msg, sk, nonce);

  EXPECT_EQ(expected_sig, sig.GetHex());
}